

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O1

void __thiscall chrono::ChParticleCloud::VariablesFbLoadForces(ChParticleCloud *this,double factor)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ChSystem *pCVar7;
  ChAparticle *pCVar8;
  pointer ppCVar9;
  Index index;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  ChVector<double> Wvel;
  double local_c8 [7];
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  ChVectorRef local_60;
  double local_48;
  double local_40;
  double local_38;
  
  pCVar7 = (this->super_ChIndexedParticles).super_ChPhysicsItem.system;
  if (pCVar7 == (ChSystem *)0x0) {
    local_c8[5] = 0.0;
    local_c8[4] = 0.0;
    local_c8[3] = 0.0;
  }
  else {
    local_c8[5] = (this->particle_mass).mass;
    local_c8[3] = local_c8[5] * (pCVar7->G_acc).m_data[0];
    local_c8[4] = local_c8[5] * (pCVar7->G_acc).m_data[1];
    local_c8[5] = local_c8[5] * (pCVar7->G_acc).m_data[2];
  }
  ppCVar9 = (this->particles).
            super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->particles).
      super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar9) {
    uVar13 = 0;
    local_c8[6] = factor;
    do {
      ChFrameMoving<double>::GetWvel_loc((ChFrameMoving<double> *)ppCVar9[uVar13]);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_48;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[0];
      auVar19._8_8_ = 0;
      auVar19._0_8_ =
           local_40 *
           *(double *)
            ((long)(this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + 8);
      auVar1 = vfmadd231sd_fma(auVar19,auVar14,auVar1);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_38;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(double *)
                      ((long)(this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array + 0x10);
      auVar1 = vfmadd231sd_fma(auVar1,auVar23,auVar2);
      local_78 = auVar1._0_8_;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *(double *)
                      ((long)(this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array + 0x18);
      auVar20._8_8_ = 0;
      auVar20._0_8_ =
           local_40 *
           *(double *)
            ((long)(this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + 0x20);
      auVar1 = vfmadd231sd_fma(auVar20,auVar14,auVar3);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(double *)
                      ((long)(this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array + 0x28);
      auVar1 = vfmadd231sd_fma(auVar1,auVar23,auVar4);
      local_88 = auVar1._0_8_;
      local_70 = local_40;
      local_68 = local_48;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(double *)
                      ((long)(this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array + 0x30);
      auVar16._8_8_ = 0;
      auVar16._0_8_ =
           local_40 *
           *(double *)
            ((long)(this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + 0x38);
      auVar1 = vfmadd231sd_fma(auVar16,auVar14,auVar5);
      local_80 = local_38;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(double *)
                      ((long)(this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array + 0x40);
      auVar1 = vfmadd231sd_fma(auVar1,auVar23,auVar6);
      local_90 = auVar1._0_8_;
      ppCVar9 = (this->particles).
                super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pCVar8 = ppCVar9[uVar13];
      local_c8[0] = local_c8[3] + (pCVar8->UserForce).m_data[0];
      local_c8[1] = local_c8[4] + (pCVar8->UserForce).m_data[1];
      local_c8[2] = local_c8[5] + (pCVar8->UserForce).m_data[2];
      ChVariables::Get_fb(&local_60,(ChVariables *)&ppCVar9[uVar13]->variables);
      if ((long)local_60.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ._8_8_ < 3) {
LAB_00539493:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      uVar10 = 3;
      if (((local_60.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ & 7) == 0) &&
         (uVar10 = (ulong)(-((uint)((ulong)local_60.
                                           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                           ._0_8_ >> 3) & 0x1fffffff) & 7), 2 < uVar10)) {
        uVar10 = 3;
      }
      if (uVar10 != 0) {
        uVar11 = 0;
        do {
          *(double *)
           (local_60.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ + uVar11 * 8) =
               local_c8[6] * local_c8[uVar11] +
               *(double *)
                (local_60.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + uVar11 * 8);
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
      if (uVar10 < 3) {
        do {
          *(double *)
           (local_60.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ + uVar10 * 8) =
               local_c8[6] * local_c8[uVar10] +
               *(double *)
                (local_60.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + uVar10 * 8);
          uVar10 = uVar10 + 1;
        } while (uVar10 != 3);
      }
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_80;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_88;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_70;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_90;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_88 * local_80;
      auVar1 = vfmsub231sd_fma(auVar15,auVar21,auVar17);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_68;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_78;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_90 * local_68;
      auVar2 = vfmsub231sd_fma(auVar18,auVar25,auVar26);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_78 * local_70;
      auVar3 = vfmsub231sd_fma(auVar22,auVar24,auVar27);
      ppCVar9 = (this->particles).
                super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pCVar8 = ppCVar9[uVar13];
      local_c8[0] = (pCVar8->UserTorque).m_data[0] - auVar1._0_8_;
      local_c8[1] = (pCVar8->UserTorque).m_data[1] - auVar2._0_8_;
      local_c8[2] = (pCVar8->UserTorque).m_data[2] - auVar3._0_8_;
      ChVariables::Get_fb(&local_60,(ChVariables *)&ppCVar9[uVar13]->variables);
      if ((long)local_60.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ._8_8_ < 6) goto LAB_00539493;
      uVar10 = local_60.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._0_8_ + 0x18;
      uVar11 = 3;
      if (((uVar10 & 7) == 0) &&
         (uVar11 = (ulong)(-((uint)(uVar10 >> 3) & 0x1fffffff) & 7), 2 < uVar11)) {
        uVar11 = 3;
      }
      if (uVar11 != 0) {
        uVar12 = 0;
        do {
          *(double *)(uVar10 + uVar12 * 8) =
               local_c8[6] * local_c8[uVar12] + *(double *)(uVar10 + uVar12 * 8);
          uVar12 = uVar12 + 1;
        } while (uVar11 != uVar12);
      }
      if (uVar11 < 3) {
        do {
          *(double *)(uVar10 + uVar11 * 8) =
               local_c8[6] * local_c8[uVar11] + *(double *)(uVar10 + uVar11 * 8);
          uVar11 = uVar11 + 1;
        } while (uVar11 != 3);
      }
      uVar13 = (ulong)((int)uVar13 + 1);
      ppCVar9 = (this->particles).
                super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(this->particles).
                                    super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar9 >> 3)
            );
  }
  return;
}

Assistant:

void ChParticleCloud::VariablesFbLoadForces(double factor) {
    ChVector<> Gforce;
    if (GetSystem())
        Gforce = GetSystem()->Get_G_acc() * particle_mass.GetBodyMass();

    for (unsigned int j = 0; j < particles.size(); j++) {
        // particle gyroscopic force:
        ChVector<> Wvel = particles[j]->GetWvel_loc();
        ChVector<> gyro = Vcross(Wvel, particle_mass.GetBodyInertia() * Wvel);

        // add applied forces and torques (and also the gyroscopic torque and gravity!) to 'fb' vector
        particles[j]->variables.Get_fb().segment(0, 3) += factor * (particles[j]->UserForce + Gforce).eigen();
        particles[j]->variables.Get_fb().segment(3, 3) += factor * (particles[j]->UserTorque - gyro).eigen();
    }
}